

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::Plain
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,idx_t num_values,
          idx_t result_offset,Vector *result)

{
  string *msg;
  allocator *this_00;
  allocator local_51;
  string local_50 [80];
  
  msg = (string *)__cxa_allocate_exception(0x10);
  this_00 = &local_51;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_50,"Plain not implemented",this_00);
  NotImplementedException::NotImplementedException((NotImplementedException *)this_00,msg);
  __cxa_throw(msg,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

void ColumnReader::Plain(ByteBuffer &plain_data, uint8_t *defines, idx_t num_values, // NOLINT
                         idx_t result_offset, Vector &result) {
	throw NotImplementedException("Plain not implemented");
}